

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O2

bool __thiscall anon_unknown.dwarf_26ba73::PulsePlayback::reset(PulsePlayback *this)

{
  PulseMainloop *this_00;
  pa_sample_spec *spec;
  uint uVar1;
  ALCdevice *pAVar2;
  char *device_name;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  pa_sample_format_t pVar6;
  ALuint AVar7;
  uint uVar8;
  pa_operation *ppVar9;
  pa_stream *ppVar10;
  undefined8 *puVar11;
  backend_exception *this_01;
  pa_stream_flags_t pVar12;
  pa_stream_flags_t flags;
  undefined1 *__src;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  unique_lock<std::mutex> plock;
  pa_channel_map chanmap;
  
  std::unique_lock<std::mutex>::unique_lock(&plock,&(this->mMainloop).mMutex);
  if (this->mStream != (pa_stream *)0x0) {
    (*(anonymous_namespace)::ppa_stream_set_state_callback)(this->mStream,0,0);
    (*(anonymous_namespace)::ppa_stream_set_moved_callback)(this->mStream,0,0);
    (*(anonymous_namespace)::ppa_stream_set_write_callback)(this->mStream,0,0);
    (*(anonymous_namespace)::ppa_stream_set_buffer_attr_callback)(this->mStream,0,0);
    (*(anonymous_namespace)::ppa_stream_disconnect)(this->mStream);
    (*(anonymous_namespace)::ppa_stream_unref)(this->mStream);
    this->mStream = (pa_stream *)0x0;
  }
  ppVar9 = (pa_operation *)
           (*(anonymous_namespace)::ppa_context_get_sink_info_by_name)
                     (this->mContext,(this->mDeviceName)._M_dataplus._M_p,sinkInfoCallbackC,this);
  this_00 = &this->mMainloop;
  PulseMainloop::waitForOperation(this_00,ppVar9,&plock);
  iVar4 = GetConfigValueBool((char *)0x0,"pulse","allow-moves",1);
  iVar5 = GetConfigValueBool((((this->super_BackendBase).mDevice)->DeviceName)._M_dataplus._M_p,
                             "pulse","adjust-latency",0);
  pVar12 = (uint)(iVar4 == 0) << 9;
  flags = pVar12 | (PA_STREAM_ADJUST_LATENCY|PA_STREAM_AUTO_TIMING_UPDATE|
                    PA_STREAM_INTERPOLATE_TIMING|PA_STREAM_START_CORKED);
  if (iVar5 == 0) {
    flags = pVar12 | (PA_STREAM_EARLY_REQUESTS|PA_STREAM_AUTO_TIMING_UPDATE|
                      PA_STREAM_INTERPOLATE_TIMING|PA_STREAM_START_CORKED);
  }
  iVar4 = GetConfigValueBool((((this->super_BackendBase).mDevice)->DeviceName)._M_dataplus._M_p,
                             "pulse","fix-rate",0);
  pAVar2 = (this->super_BackendBase).mDevice;
  if ((iVar4 != 0) || (((pAVar2->Flags).vals & 1) == 0)) {
    flags = flags | PA_STREAM_FIX_RATE;
  }
  memset(&chanmap,0,0x84);
  switch(pAVar2->FmtChans) {
  case DevFmtMono:
    __src = (anonymous_namespace)::MonoChanMap;
    break;
  case DevFmtQuad:
    __src = (anonymous_namespace)::QuadChanMap;
    break;
  case DevFmtX51:
    __src = (anonymous_namespace)::X51ChanMap;
    break;
  case DevFmtX61:
    __src = (anonymous_namespace)::X61ChanMap;
    break;
  case DevFmtX71:
    __src = (anonymous_namespace)::X71ChanMap;
    break;
  case DevFmtAmbi3D:
    pAVar2->FmtChans = DevFmtChannelsDefault;
  case DevFmtChannelsDefault:
    __src = (anonymous_namespace)::StereoChanMap;
    break;
  case DevFmtX51Rear:
    __src = (anonymous_namespace)::X51RearChanMap;
    break;
  default:
    goto switchD_00161bf2_default;
  }
  memcpy(&chanmap,__src,0x84);
switchD_00161bf2_default:
  SetChannelOrderFromMap(pAVar2,&chanmap);
  pAVar2 = (this->super_BackendBase).mDevice;
  pVar6 = PA_SAMPLE_U8;
  switch(pAVar2->FmtType) {
  case DevFmtByte:
    pAVar2->FmtType = DevFmtUByte;
    break;
  case DevFmtUByte:
    break;
  case DevFmtUShort:
    pAVar2->FmtType = DevFmtShort;
  case DevFmtShort:
    pVar6 = PA_SAMPLE_S16LE;
    break;
  case DevFmtUInt:
    pAVar2->FmtType = DevFmtInt;
  case DevFmtInt:
    pVar6 = PA_SAMPLE_S32LE;
    break;
  case DevFmtFloat:
    pVar6 = PA_SAMPLE_FLOAT32LE;
    break;
  default:
    goto switchD_00161c73_default;
  }
  (this->mSpec).format = pVar6;
switchD_00161c73_default:
  spec = &this->mSpec;
  (this->mSpec).rate = pAVar2->Frequency;
  AVar7 = ALCdevice::channelsFromFmt(pAVar2);
  (this->mSpec).channels = (uint8_t)AVar7;
  iVar4 = (*(anonymous_namespace)::ppa_sample_spec_valid)(spec);
  if (iVar4 == 0) {
    this_01 = (backend_exception *)__cxa_allocate_exception(0x30);
    al::backend_exception::backend_exception(this_01,0xa004,"Invalid sample spec");
    __cxa_throw(this_01,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
  }
  iVar4 = (*(anonymous_namespace)::ppa_frame_size)(spec);
  (this->mAttr).maxlength = 0xffffffff;
  pAVar2 = (this->super_BackendBase).mDevice;
  device_name = (this->mDeviceName)._M_dataplus._M_p;
  (this->mAttr).tlength = pAVar2->BufferSize * iVar4;
  (this->mAttr).prebuf = 0;
  (this->mAttr).minreq = iVar4 * pAVar2->UpdateSize;
  (this->mAttr).fragsize = 0xffffffff;
  ppVar10 = PulseMainloop::connectStream
                      (this_00,device_name,&plock,this->mContext,flags,&this->mAttr,spec,&chanmap,
                       Playback);
  this->mStream = ppVar10;
  (*(anonymous_namespace)::ppa_stream_set_state_callback)(ppVar10,streamStateCallbackC,this);
  (*(anonymous_namespace)::ppa_stream_set_moved_callback)(this->mStream,streamMovedCallbackC,this);
  puVar11 = (undefined8 *)(*(anonymous_namespace)::ppa_stream_get_sample_spec)(this->mStream);
  *(undefined4 *)&(this->mSpec).channels = *(undefined4 *)(puVar11 + 1);
  uVar3 = *puVar11;
  spec->format = (int)uVar3;
  spec->rate = (int)((ulong)uVar3 >> 0x20);
  uVar8 = (*(anonymous_namespace)::ppa_frame_size)(spec);
  this->mFrameSize = uVar8;
  pAVar2 = (this->super_BackendBase).mDevice;
  uVar1 = (this->mSpec).rate;
  if (pAVar2->Frequency != uVar1) {
    dVar13 = (double)uVar1 / (double)pAVar2->Frequency;
    dVar14 = (double)pAVar2->UpdateSize * dVar13 + 0.5;
    dVar16 = 64.0;
    if (64.0 <= dVar14) {
      dVar16 = dVar14;
    }
    if (8192.0 <= dVar16) {
      dVar16 = 8192.0;
    }
    dVar14 = (double)pAVar2->BufferSize * dVar13 + 0.5;
    dVar13 = (double)(uint)((int)(long)dVar16 * 2);
    dVar15 = (double)(int)(0x7fffffff / (ulong)uVar8);
    if (dVar13 <= dVar14) {
      dVar13 = dVar14;
    }
    if (dVar15 <= dVar13) {
      dVar13 = dVar15;
    }
    (this->mAttr).maxlength = 0xffffffff;
    (this->mAttr).tlength = (int)(long)dVar13 * uVar8;
    (this->mAttr).prebuf = 0;
    (this->mAttr).minreq = (int)(long)dVar16 * uVar8;
    ppVar9 = (pa_operation *)
             (*(anonymous_namespace)::ppa_stream_set_buffer_attr)
                       (this->mStream,&this->mAttr,PulseMainloop::streamSuccessCallbackC,this_00);
    PulseMainloop::waitForOperation(this_00,ppVar9,&plock);
    ((this->super_BackendBase).mDevice)->Frequency = (this->mSpec).rate;
  }
  (*(anonymous_namespace)::ppa_stream_set_buffer_attr_callback)
            (this->mStream,bufferAttrCallbackC,this);
  bufferAttrCallback(this,this->mStream);
  uVar1 = this->mFrameSize;
  pAVar2 = (this->super_BackendBase).mDevice;
  pAVar2->BufferSize = (this->mAttr).tlength / uVar1;
  pAVar2->UpdateSize = (this->mAttr).minreq / uVar1;
  std::unique_lock<std::mutex>::~unique_lock(&plock);
  return true;
}

Assistant:

bool PulsePlayback::reset()
{
    auto plock = mMainloop.getUniqueLock();

    if(mStream)
    {
        pa_stream_set_state_callback(mStream, nullptr, nullptr);
        pa_stream_set_moved_callback(mStream, nullptr, nullptr);
        pa_stream_set_write_callback(mStream, nullptr, nullptr);
        pa_stream_set_buffer_attr_callback(mStream, nullptr, nullptr);
        pa_stream_disconnect(mStream);
        pa_stream_unref(mStream);
        mStream = nullptr;
    }

    pa_operation *op{pa_context_get_sink_info_by_name(mContext, mDeviceName.c_str(),
        &PulsePlayback::sinkInfoCallbackC, this)};
    mMainloop.waitForOperation(op, plock);

    pa_stream_flags_t flags{PA_STREAM_START_CORKED | PA_STREAM_INTERPOLATE_TIMING |
        PA_STREAM_AUTO_TIMING_UPDATE | PA_STREAM_EARLY_REQUESTS};
    if(!GetConfigValueBool(nullptr, "pulse", "allow-moves", 1))
        flags |= PA_STREAM_DONT_MOVE;
    if(GetConfigValueBool(mDevice->DeviceName.c_str(), "pulse", "adjust-latency", 0))
    {
        /* ADJUST_LATENCY can't be specified with EARLY_REQUESTS, for some
         * reason. So if the user wants to adjust the overall device latency,
         * we can't ask to get write signals as soon as minreq is reached.
         */
        flags &= ~PA_STREAM_EARLY_REQUESTS;
        flags |= PA_STREAM_ADJUST_LATENCY;
    }
    if(GetConfigValueBool(mDevice->DeviceName.c_str(), "pulse", "fix-rate", 0) ||
       !mDevice->Flags.get<FrequencyRequest>())
        flags |= PA_STREAM_FIX_RATE;

    pa_channel_map chanmap{};
    switch(mDevice->FmtChans)
    {
    case DevFmtMono:
        chanmap = MonoChanMap;
        break;
    case DevFmtAmbi3D:
        mDevice->FmtChans = DevFmtStereo;
        /*fall-through*/
    case DevFmtStereo:
        chanmap = StereoChanMap;
        break;
    case DevFmtQuad:
        chanmap = QuadChanMap;
        break;
    case DevFmtX51:
        chanmap = X51ChanMap;
        break;
    case DevFmtX51Rear:
        chanmap = X51RearChanMap;
        break;
    case DevFmtX61:
        chanmap = X61ChanMap;
        break;
    case DevFmtX71:
        chanmap = X71ChanMap;
        break;
    }
    SetChannelOrderFromMap(mDevice, chanmap);

    switch(mDevice->FmtType)
    {
    case DevFmtByte:
        mDevice->FmtType = DevFmtUByte;
        /* fall-through */
    case DevFmtUByte:
        mSpec.format = PA_SAMPLE_U8;
        break;
    case DevFmtUShort:
        mDevice->FmtType = DevFmtShort;
        /* fall-through */
    case DevFmtShort:
        mSpec.format = PA_SAMPLE_S16NE;
        break;
    case DevFmtUInt:
        mDevice->FmtType = DevFmtInt;
        /* fall-through */
    case DevFmtInt:
        mSpec.format = PA_SAMPLE_S32NE;
        break;
    case DevFmtFloat:
        mSpec.format = PA_SAMPLE_FLOAT32NE;
        break;
    }
    mSpec.rate = mDevice->Frequency;
    mSpec.channels = static_cast<uint8_t>(mDevice->channelsFromFmt());
    if(pa_sample_spec_valid(&mSpec) == 0)
        throw al::backend_exception{ALC_INVALID_VALUE, "Invalid sample spec"};

    const ALuint frame_size{static_cast<ALuint>(pa_frame_size(&mSpec))};
    mAttr.maxlength = ~0u;
    mAttr.tlength = mDevice->BufferSize * frame_size;
    mAttr.prebuf = 0u;
    mAttr.minreq = mDevice->UpdateSize * frame_size;
    mAttr.fragsize = ~0u;

    mStream = mMainloop.connectStream(mDeviceName.c_str(), plock, mContext, flags, &mAttr, &mSpec,
        &chanmap, BackendType::Playback);

    pa_stream_set_state_callback(mStream, &PulsePlayback::streamStateCallbackC, this);
    pa_stream_set_moved_callback(mStream, &PulsePlayback::streamMovedCallbackC, this);

    mSpec = *(pa_stream_get_sample_spec(mStream));
    mFrameSize = static_cast<ALuint>(pa_frame_size(&mSpec));

    if(mDevice->Frequency != mSpec.rate)
    {
        /* Server updated our playback rate, so modify the buffer attribs
         * accordingly.
         */
        const auto scale = static_cast<double>(mSpec.rate) / mDevice->Frequency;
        const ALuint perlen{static_cast<ALuint>(clampd(scale*mDevice->UpdateSize + 0.5, 64.0,
            8192.0))};
        const ALuint buflen{static_cast<ALuint>(clampd(scale*mDevice->BufferSize + 0.5, perlen*2,
            std::numeric_limits<int>::max()/mFrameSize))};

        mAttr.maxlength = ~0u;
        mAttr.tlength = buflen * mFrameSize;
        mAttr.prebuf = 0u;
        mAttr.minreq = perlen * mFrameSize;

        op = pa_stream_set_buffer_attr(mStream, &mAttr, &PulseMainloop::streamSuccessCallbackC,
            &mMainloop);
        mMainloop.waitForOperation(op, plock);

        mDevice->Frequency = mSpec.rate;
    }

    pa_stream_set_buffer_attr_callback(mStream, &PulsePlayback::bufferAttrCallbackC, this);
    bufferAttrCallback(mStream);

    mDevice->BufferSize = mAttr.tlength / mFrameSize;
    mDevice->UpdateSize = mAttr.minreq / mFrameSize;

    return true;
}